

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shrinkStress.cpp
# Opt level: O2

void shrinkStress<2ul,3ul,unsigned_long,10ul,300ul,300ul,(char)48,(char)51>(uint32_t seed)

{
  array<unsigned_char,_2UL> aVar1;
  long lVar2;
  bool bVar3;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_15b0;
  vector<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  expectedNotSortedStorage;
  __shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2> local_1588;
  long local_1578;
  anon_class_8_1_10d00a46 checkNewIndex;
  anon_class_8_1_8990f923 randKey;
  anon_class_8_1_8990f923 randValue;
  vector<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  expectedSortedStorage;
  __shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2> local_1540;
  KV randKV;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_> local_14f8;
  anon_class_16_2_b0a10a34 checkSorted;
  anon_class_16_2_fd180e1f checkNotSorted;
  anon_class_16_2_b8051694 shrinkExpected;
  string NEW_INDEX_FILENAME;
  _Any_data local_1498;
  code *local_1488;
  code *local_1480;
  anon_class_24_3_3cda8c2f checkStorage;
  KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>
  storage;
  mt19937 rand;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&NEW_INDEX_FILENAME,"new-index",(allocator<char> *)&rand);
  std::make_shared<supermap::io::DiskFileManager>();
  local_1588._M_ptr = (element_type *)rand._M_x[0];
  local_1588._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)rand._M_x[1];
  rand._M_x[0] = 0;
  rand._M_x[1] = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(rand._M_x + 1));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rand,"keys-not-sorted",(allocator<char> *)&expectedNotSortedStorage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&randKV,"keys-sorted",(allocator<char> *)&expectedSortedStorage);
  std::__shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1540,&local_1588);
  local_1498._M_unused._M_object = (void *)0x0;
  local_1498._8_8_ = 0;
  local_1480 = std::
               _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/test/shrinkStress.cpp:45:9)>
               ::_M_invoke;
  local_1488 = std::
               _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/test/shrinkStress.cpp:45:9)>
               ::_M_manager;
  supermap::
  KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>::
  KeyValueShrinkableStorage
            (&storage,(string *)&rand,(string *)&randKV,
             (shared_ptr<supermap::io::FileManager> *)&local_1540,
             (InnerRegisterSupplier *)&local_1498);
  std::_Function_base::~_Function_base((_Function_base *)&local_1498);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1540._M_refcount);
  std::__cxx11::string::~string((string *)&randKV);
  std::__cxx11::string::~string((string *)&rand);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&rand,(ulong)seed);
  expectedNotSortedStorage.
  super__Vector_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expectedNotSortedStorage.
  super__Vector_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expectedNotSortedStorage.
  super__Vector_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expectedSortedStorage.
  super__Vector_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expectedSortedStorage.
  super__Vector_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expectedSortedStorage.
  super__Vector_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  checkNotSorted.expectedNotSortedStorage = &expectedNotSortedStorage;
  checkSorted.storage = &storage;
  checkNewIndex.expectedSortedStorage = &expectedSortedStorage;
  randKey.rand = &rand;
  checkSorted.expectedSortedStorage = &expectedSortedStorage;
  checkNotSorted.storage = checkSorted.storage;
  shrinkExpected.expectedSortedStorage = &expectedSortedStorage;
  shrinkExpected.expectedNotSortedStorage = checkNotSorted.expectedNotSortedStorage;
  checkStorage.storage = checkSorted.storage;
  checkStorage.expectedSortedStorage = &expectedSortedStorage;
  checkStorage.expectedNotSortedStorage = checkNotSorted.expectedNotSortedStorage;
  for (local_1578 = 0; local_1578 != 300; local_1578 = local_1578 + 1) {
    lVar2 = 300;
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      aVar1._M_elems =
           (_Type)shrinkStress<2UL,_3UL,_unsigned_long,_10UL,_300UL,_300UL,_'0',_'3'>::
                  anon_class_8_1_8990f923::operator()(&randKey);
      shrinkStress<2UL,_3UL,_unsigned_long,_10UL,_300UL,_300UL,_'0',_'3'>::anon_class_8_1_8990f923::
      operator()((anon_class_8_1_8990f923 *)&local_15b0);
      randKV.value.data_._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           local_15b0._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      local_15b0._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
           (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
      randKV.key.super_array<unsigned_char,_2UL>._M_elems =
           (array<unsigned_char,_2UL>)(array<unsigned_char,_2UL>)aVar1._M_elems;
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_15b0);
      std::
      vector<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
      ::push_back(&expectedNotSortedStorage,(value_type *)&randKV);
      supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>::KeyValue
                (&local_14f8,(KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_> *)&randKV);
      supermap::
      OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
      ::appendCopy((OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
                    *)&storage,&local_14f8);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                (&local_14f8.value.data_);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                (&randKV.value.data_);
    }
    shrinkStress<2UL,_3UL,_unsigned_long,_10UL,_300UL,_300UL,_'0',_'3'>::anon_class_16_2_b8051694::
    operator()(&shrinkExpected);
    supermap::
    KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>::
    shrink((KeyIndexStorage *)&randKV,&storage,10,&NEW_INDEX_FILENAME);
    shrinkStress<2UL,_3UL,_unsigned_long,_10UL,_300UL,_300UL,_'0',_'3'>::anon_class_8_1_10d00a46::
    operator()(&checkNewIndex,(KeyIndexStorage *)&randKV);
    supermap::
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
    ::~SingleFileIndexedStorage
              ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
                *)&randKV);
    shrinkStress<2UL,_3UL,_unsigned_long,_10UL,_300UL,_300UL,_'0',_'3'>::anon_class_24_3_3cda8c2f::
    operator()(&checkStorage);
    shrinkStress<2UL,_3UL,_unsigned_long,_10UL,_300UL,_300UL,_'0',_'3'>::anon_class_16_2_fd180e1f::
    operator()(&checkNotSorted);
    shrinkStress<2UL,_3UL,_unsigned_long,_10UL,_300UL,_300UL,_'0',_'3'>::anon_class_16_2_b0a10a34::
    operator()(&checkSorted);
  }
  std::
  vector<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ::~vector(&expectedSortedStorage);
  std::
  vector<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ::~vector(&expectedNotSortedStorage);
  supermap::
  KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>::
  ~KeyValueShrinkableStorage(&storage);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1588._M_refcount);
  std::__cxx11::string::~string((string *)&NEW_INDEX_FILENAME);
  return;
}

Assistant:

void shrinkStress(std::uint32_t seed) {
    using namespace supermap;
    using K = Key<KeyLen>;
    using V = ByteArray<ValueLen>;
    using KV = KeyValue<Key<KeyLen>, ByteArray<ValueLen>>;
    using KI = KeyValue<K, IndexT>;
    using REG = VoidRegister<KI>;

    const std::string NEW_INDEX_FILENAME = "new-index";

    std::shared_ptr<io::FileManager> manager = std::make_shared<io::DiskFileManager>();
    KeyValueShrinkableStorage<K, V, IndexT, void> storage(
        "keys-not-sorted",
        "keys-sorted",
        manager,
        []() { return std::make_unique<REG>(); }
    );

    std::mt19937 rand(seed);

    auto randValue = [&]() {
        std::string v;
        for (std::size_t i = 0; i < ValueLen; ++i) {
            v += static_cast<char>(rand() % (AlphabetEnd - AlphabetBegin + 1) + AlphabetBegin);
        }
        return V::fromString(v);
    };
    auto randKey = [&]() {
        std::string k;
        for (std::size_t i = 0; i < KeyLen; ++i) {
            k += static_cast<char>(rand() % (AlphabetEnd - AlphabetBegin + 1) + AlphabetBegin);
        }
        return K::fromString(k);
    };

    std::vector<KV> expectedNotSortedStorage;
    std::vector<KV> expectedSortedStorage;

    auto appendToExpected = [&](const KV &kv) {
        expectedNotSortedStorage.push_back(kv);
    };

    auto shrinkExpected = [&]() {
        std::vector<KV> newSorted;
        for (auto sortedIt = expectedSortedStorage.begin(); sortedIt < expectedSortedStorage.end(); ++sortedIt) {
            newSorted.push_back(std::move(*sortedIt));
        }
        for (auto notSortedIt = expectedNotSortedStorage.begin(); notSortedIt < expectedNotSortedStorage.end();
             ++notSortedIt) {
            newSorted.push_back(std::move(*notSortedIt));
        }
        auto newSortedEnd = SortedSingleFileIndexedStorage<KV, IndexT, REG, K>::sortedEndIterator(
            newSorted.begin(),
            newSorted.end(),
            [](const KV &a, const KV &b) { return a.key < b.key; },
            [](const KV &a, const KV &b) { return a.key == b.key; }
        );
        expectedNotSortedStorage = {};
        expectedSortedStorage = {};
        for (auto it = newSorted.begin(); it < newSortedEnd; ++it) {
            expectedSortedStorage.push_back(std::move(*it));
        }
    };

    auto checkNotSorted = [&]() {
        std::vector<KV> actualNotSorted = storage.getNotSortedEntries().collect();
        CHECK_EQ(actualNotSorted.size(), expectedNotSortedStorage.size());
        CHECK_EQ(actualNotSorted, expectedNotSortedStorage);
    };

    auto checkSorted = [&]() {
        std::vector<KV> actualSorted = storage.getSortedEntries().collect();
        auto actualSortedSize = actualSorted.size();
        auto expectedSortedSize = expectedSortedStorage.size();
        CHECK_EQ(actualSortedSize, expectedSortedSize);
        CHECK_EQ(actualSorted, expectedSortedStorage);
    };

    auto checkStorage = [&]() {
        CHECK_EQ(storage.getItemsCount(), expectedSortedStorage.size() + expectedNotSortedStorage.size());
        CHECK_EQ(storage.getNotSortedItemsCount(), expectedNotSortedStorage.size());
        CHECK_EQ(storage.getSortedItemsCount(), expectedSortedStorage.size());
        for (IndexT i = 0; i < expectedSortedStorage.size(); ++i) {
            CHECK_EQ(storage.get(i), expectedSortedStorage[i]);
        }
        for (IndexT i = 0; i < expectedNotSortedStorage.size(); ++i) {
            CHECK_EQ(storage.get(i + expectedSortedStorage.size()), expectedNotSortedStorage[i]);
        }
    };

    auto checkNewIndex = [&](const SortedSingleFileIndexedStorage<KI, IndexT, void, K> &newIndex) {
        auto newIndexSize = newIndex.getItemsCount();
        auto sortedSize = expectedSortedStorage.size();
        CHECK_EQ(newIndexSize, sortedSize);
        for (IndexT i = 0; i < expectedSortedStorage.size(); ++i) {
            IndexT curInd = newIndex.get(i).value;
            K curKey = newIndex.get(i).key;
            K expectedKey = expectedSortedStorage[i].key;
            CHECK_EQ(curInd, i);
            CHECK_EQ(curKey, expectedKey);
        }
    };

    for (std::size_t iter = 0; iter < Iterations; ++iter) {
        for (std::size_t step = 0; step < IterationLen; ++step) {
            KV randKV(randKey(), randValue());
            appendToExpected(randKV);
            storage.appendCopy(randKV);
        }
        shrinkExpected();
        checkNewIndex(storage.shrink(BatchSize, NEW_INDEX_FILENAME));
        checkStorage();
        checkNotSorted();
        checkSorted();
    }
}